

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::handleTick(Timer *this)

{
  SmartPtr<Event> SVar1;
  bool bVar2;
  TimerNode *pTVar3;
  Event *pEVar4;
  uint newTicks;
  int32_t diff;
  undefined1 local_50 [8];
  TimerNode timer;
  AutoLock _auto_lock_;
  Timer *this_local;
  
  AutoLock::AutoLock((AutoLock *)&timer.mRepeatMS,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xbb);
  this->mTicks = this->mTicks + 1;
  TimerNode::TimerNode((TimerNode *)local_50);
  while (bVar2 = JetHead::list<Timer::TimerNode>::empty(&this->mList), ((bVar2 ^ 0xffU) & 1) != 0) {
    JetHead::list<Timer::TimerNode>::begin((list<Timer::TimerNode> *)&newTicks);
    pTVar3 = JetHead::list<Timer::TimerNode>::iterator::operator*((iterator *)&newTicks);
    TimerNode::operator=((TimerNode *)local_50,pTVar3);
    JetHead::list<Timer::TimerNode>::iterator::~iterator((iterator *)&newTicks);
    if (0 < (int)(timer.mListener._4_4_ - this->mTicks)) break;
    JetHead::list<Timer::TimerNode>::pop_front(&this->mList);
    bVar2 = SmartPtr<Event>::operator==((SmartPtr<Event> *)local_50,(Event *)0x0);
    SVar1 = timer.mEvent;
    if (bVar2) {
      (**(timer.mDispatcher)->_vptr_IEventDispatcher)
                (timer.mDispatcher,(ulong)(uint)timer.mListener);
    }
    else {
      pEVar4 = SmartPtr::operator_cast_to_Event_((SmartPtr *)local_50);
      (*((SVar1.mObj)->super_RefCount)._vptr_RefCount[1])(SVar1.mObj,pEVar4);
    }
    if (timer.mPrivateData == 0) {
      SmartPtr<Event>::operator=((SmartPtr<Event> *)local_50,(Event *)0x0);
    }
    else {
      timer.mListener._4_4_ =
           timer.mListener._4_4_ +
           (~timer.mTick + timer.mPrivateData + this->mMsPerTick) / (uint)this->mMsPerTick;
      timer.mTick = (timer.mPrivateData + timer.mTick) % (uint)this->mMsPerTick;
      addTimerNode(this,(TimerNode *)local_50);
    }
  }
  TimerNode::~TimerNode((TimerNode *)local_50);
  AutoLock::~AutoLock((AutoLock *)&timer.mRepeatMS);
  return;
}

Assistant:

void Timer::handleTick()
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );
	
	mTicks++;
	
	TimerNode timer;
	
	while (not mList.empty())
	{
		timer = *mList.begin();
		
		int32_t diff = timer.mTick - mTicks;
		
		// List is sorted with nearest items first.  Once we find a node
		// that is in the future we are done.
		if ( diff > 0 )
			break;
		
		// Remove the timer from the list now
		mList.pop_front();

		// If the timer doesn't have an event then we call the listener
		if ( timer.mEvent == NULL )
		{
			timer.mListener->onTimeout( timer.mPrivateData );
		}
		// Otherwise send the event
		else
		{
			// Send the event to the specified dispatcher
			timer.mDispatcher->sendEvent( timer.mEvent );
		}
		
		// Check to see if this is a periodic timer.   If it is then
		// we need to re-calculate the tick value for the timer.  In
		// addition we are going to calculate the # of ms that are
		// lost by the tick calculation and accumulate them so that
		// over time we line up properly whenever possible.
		if (timer.mRepeatMS != 0)
		{
			unsigned newTicks = (timer.mRepeatMS + mMsPerTick - 1 - 
								 timer.mRemainingMS) / mMsPerTick;
			timer.mTick += newTicks;
			timer.mRemainingMS = (timer.mRepeatMS + timer.mRemainingMS) % 
				mMsPerTick;
			addTimerNode(timer);
		}
		// If this is a non-periodic then release our reference to
		// the event if we have one
		else
		{
			timer.mEvent = NULL;
		}
	}
}